

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O1

void __thiscall
kratos::Property::Property
          (Property *this,string *property_name,shared_ptr<kratos::Sequence> *sequence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  
  paVar1 = &(this->property_name_).field_2;
  (this->property_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (property_name->_M_dataplus)._M_p;
  paVar2 = &property_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&property_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->property_name_).field_2 + 8) = uVar5;
  }
  else {
    (this->property_name_)._M_dataplus._M_p = pcVar3;
    (this->property_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->property_name_)._M_string_length = property_name->_M_string_length;
  (property_name->_M_dataplus)._M_p = (pointer)paVar2;
  property_name->_M_string_length = 0;
  (property_name->field_2)._M_local_buf[0] = '\0';
  (this->sequence_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sequence->super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->sequence_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (sequence->super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (sequence->super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sequence_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var4;
  (sequence->super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  this->action_ = None;
  (this->edge_).delay = 0;
  (this->edge_).var = (Var *)0x0;
  *(undefined8 *)((long)&(this->edge_).var + 4) = 0;
  (this->edge_).edge = Posedge;
  (this->edge_).delay_side = left;
  return;
}

Assistant:

Property::Property(std::string property_name, std::shared_ptr<Sequence> sequence)
    : property_name_(std::move(property_name)), sequence_(std::move(sequence)) {}